

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::Context::Context
          (Context *this,FileDescriptor *file,Options *options)

{
  ClassNameResolver *this_00;
  Options *options_local;
  FileDescriptor *file_local;
  Context *this_local;
  
  this_00 = (ClassNameResolver *)operator_new(0x70);
  ClassNameResolver::ClassNameResolver(this_00,options);
  std::
  unique_ptr<google::protobuf::compiler::java::ClassNameResolver,std::default_delete<google::protobuf::compiler::java::ClassNameResolver>>
  ::unique_ptr<std::default_delete<google::protobuf::compiler::java::ClassNameResolver>,void>
            ((unique_ptr<google::protobuf::compiler::java::ClassNameResolver,std::default_delete<google::protobuf::compiler::java::ClassNameResolver>>
              *)this,this_00);
  absl::lts_20250127::
  flat_hash_map<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::FieldGeneratorInfo,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_google::protobuf::compiler::java::FieldGeneratorInfo>_>_>
  ::flat_hash_map(&this->field_generator_info_map_);
  absl::lts_20250127::
  flat_hash_map<const_google::protobuf::OneofDescriptor_*,_google::protobuf::compiler::java::OneofGeneratorInfo,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::OneofDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::OneofDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::OneofDescriptor_*const,_google::protobuf::compiler::java::OneofGeneratorInfo>_>_>
  ::flat_hash_map(&this->oneof_generator_info_map_);
  java::Options::Options(&this->options_,options);
  InitializeFieldGeneratorInfo(this,file);
  return;
}

Assistant:

Context::Context(const FileDescriptor* file, const Options& options)
    : name_resolver_(new ClassNameResolver(options)), options_(options) {
  InitializeFieldGeneratorInfo(file);
}